

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int ARKStepGetNonlinSolvStats(void *arkode_mem,long *nniters,long *nnfails)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepGetNonlinSolvStats",&local_18,&local_20);
  if (iVar1 == 0) {
    *nniters = local_20->nls_iters;
    *nnfails = local_20->nls_fails;
  }
  return iVar1;
}

Assistant:

int ARKStepGetNonlinSolvStats(void *arkode_mem, long int *nniters,
                              long int *nnfails)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepGetNonlinSolvStats",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  *nniters = step_mem->nls_iters;
  *nnfails = step_mem->nls_fails;

  return(ARK_SUCCESS);
}